

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_TestIterSubTypes_Test::TestBody(TypeTest_TestIterSubTypes_Test *this)

{
  allocator<wasm::HeapType> *this_00;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_00;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_01;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_02;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_03;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_04;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_05;
  initializer_list<wasm::HeapType> __l_06;
  bool bVar1;
  Entry *pEVar2;
  char *pcVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar4;
  char *in_R9;
  Entry EVar5;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  AssertHelper local_8a8;
  Message local_8a0;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_893;
  key_equal local_892;
  hasher local_891;
  int local_890 [2];
  pair<wasm::HeapType,_unsigned_int> local_888;
  pair<wasm::HeapType,_unsigned_int> local_878;
  iterator local_868;
  size_type local_860;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_858;
  uintptr_t local_820;
  TypeDepths local_818;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_6;
  Message local_7c8;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_7bb;
  key_equal local_7ba;
  hasher local_7b9;
  int local_7b8 [2];
  pair<wasm::HeapType,_unsigned_int> local_7b0;
  pair<wasm::HeapType,_unsigned_int> local_7a0;
  iterator local_790;
  size_type local_788;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_780;
  uintptr_t local_748;
  TypeDepths local_740;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_5;
  Message local_6f0;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_6e7;
  key_equal local_6e6;
  hasher local_6e5;
  int local_6e4;
  pair<wasm::HeapType,_unsigned_int> local_6e0;
  iterator local_6d0;
  size_type local_6c8;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_6c0;
  uintptr_t local_688;
  TypeDepths local_680;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_4;
  Message local_630;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_623;
  key_equal local_622;
  hasher local_621;
  int local_620 [4];
  pair<wasm::HeapType,_unsigned_int> local_610;
  pair<wasm::HeapType,_unsigned_int> local_600;
  pair<wasm::HeapType,_unsigned_int> local_5f0;
  pair<wasm::HeapType,_unsigned_int> local_5e0;
  iterator local_5d0;
  size_type local_5c8;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_5c0;
  uintptr_t local_588;
  TypeDepths local_580;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_3;
  Message local_530;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_523;
  key_equal local_522;
  hasher local_521;
  int local_520 [4];
  pair<wasm::HeapType,_unsigned_int> local_510;
  pair<wasm::HeapType,_unsigned_int> local_500;
  pair<wasm::HeapType,_unsigned_int> local_4f0;
  pair<wasm::HeapType,_unsigned_int> local_4e0;
  iterator local_4d0;
  size_type local_4c8;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_4c0;
  uintptr_t local_488;
  TypeDepths local_480;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_2;
  Message local_430;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_427;
  key_equal local_426;
  hasher local_425;
  int local_424 [3];
  pair<wasm::HeapType,_unsigned_int> local_418;
  pair<wasm::HeapType,_unsigned_int> local_408;
  pair<wasm::HeapType,_unsigned_int> local_3f8;
  iterator local_3e8;
  size_type local_3e0;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_3d8;
  uintptr_t local_3a0;
  TypeDepths local_398;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_1;
  Message local_348;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_33f;
  key_equal local_33e;
  hasher local_33d;
  int local_33c;
  pair<wasm::HeapType,_unsigned_int> local_338;
  iterator local_328;
  size_type local_320;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_318;
  uintptr_t local_2e0;
  TypeDepths local_2d8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  anon_class_8_1_6b5fb797 getSubTypes;
  HeapType local_280;
  uintptr_t local_278;
  uintptr_t local_270;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_268;
  iterator local_260;
  size_type local_258;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_250;
  undefined1 local_238 [8];
  SubTypes subTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  undefined1 local_158 [12];
  Entry local_148;
  Struct local_138;
  Entry local_118;
  undefined1 local_108 [12];
  Entry local_f8;
  Struct local_e8;
  Entry local_c8;
  undefined1 local_b8 [12];
  Entry local_a8;
  Struct local_98 [2];
  Entry local_68;
  Struct local_58;
  TypeBuilder local_38;
  TypeBuilder builder;
  HeapType D;
  HeapType C;
  HeapType B;
  HeapType A;
  TypeTest_TestIterSubTypes_Test *this_local;
  
  ::wasm::HeapType::HeapType(&B);
  ::wasm::HeapType::HeapType(&C);
  ::wasm::HeapType::HeapType(&D);
  ::wasm::HeapType::HeapType((HeapType *)&builder);
  ::wasm::TypeBuilder::TypeBuilder(&local_38,4);
  local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_58);
  local_68 = ::wasm::TypeBuilder::operator[](&local_38,0);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_68,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_58);
  ::wasm::Struct::~Struct(&local_58);
  local_98[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_98);
  local_a8 = ::wasm::TypeBuilder::operator[](&local_38,1);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_a8,true);
  local_c8 = ::wasm::TypeBuilder::operator[](&local_38,0);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_b8,&local_c8);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_b8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_b8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_b8._9_3_;
  pEVar2 = ::wasm::TypeBuilder::Entry::subTypeOf(pEVar2,other);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,local_98);
  ::wasm::Struct::~Struct(local_98);
  local_e8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_e8);
  local_f8 = ::wasm::TypeBuilder::operator[](&local_38,2);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_f8,true);
  local_118 = ::wasm::TypeBuilder::operator[](&local_38,0);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_108,&local_118);
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_108._0_8_;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_108[8];
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_108._9_3_;
  pEVar2 = ::wasm::TypeBuilder::Entry::subTypeOf(pEVar2,other_00);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_e8);
  ::wasm::Struct::~Struct(&local_e8);
  local_138.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_138);
  local_148 = ::wasm::TypeBuilder::operator[](&local_38,3);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_148,true);
  EVar5 = ::wasm::TypeBuilder::operator[](&local_38,2);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar5.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_158,
             (Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18));
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_158._0_8_;
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_158[8];
  other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_158._9_3_;
  pEVar2 = ::wasm::TypeBuilder::Entry::subTypeOf(pEVar2,other_01);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_138);
  ::wasm::Struct::~Struct(&local_138);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_198,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c8,(internal *)local_198,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x69a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket,__x);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,0);
    B.id = pvVar4->id;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,1);
    C.id = pvVar4->id;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,2);
    D.id = pvVar4->id;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,3);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         pvVar4->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_38);
  if (bVar1) {
    local_280.id = B.id;
    local_278 = C.id;
    local_270 = D.id;
    local_268._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_260 = &local_280;
    local_258 = 4;
    this_00 = (allocator<wasm::HeapType> *)((long)&getSubTypes.subTypes + 7);
    std::allocator<wasm::HeapType>::allocator(this_00);
    __l_06._M_len = local_258;
    __l_06._M_array = local_260;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_250,__l_06,this_00);
    ::wasm::SubTypes::SubTypes((SubTypes *)local_238,&local_250);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_250);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)((long)&getSubTypes.subTypes + 7));
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_238;
    local_2e0 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_2d8,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,0);
    local_33c = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_338,&B,&local_33c);
    local_328 = &local_338;
    local_320 = 1;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_33f);
    __l_05._M_len = local_320;
    __l_05._M_array = local_328;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_318,__l_05,0,&local_33d,&local_33e,&local_33f);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_2a0,"getSubTypes(A, 0)","TypeDepths({{A, 0}})",&local_2d8,
               &local_318);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_318);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_33f);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_2d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6af,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    local_3a0 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_398,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,1);
    local_424[2] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_418,&B,local_424 + 2);
    local_424[1] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_408,&C,local_424 + 1);
    local_424[0] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_3f8,&D,local_424);
    local_3e8 = &local_418;
    local_3e0 = 3;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_427);
    __l_04._M_len = local_3e0;
    __l_04._M_array = local_3e8;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_3d8,__l_04,0,&local_425,&local_426,&local_427);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_360,"getSubTypes(A, 1)","TypeDepths({{A, 0}, {B, 1}, {C, 1}})",
               &local_398,&local_3d8);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_3d8);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_427);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_398);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar1) {
      testing::Message::Message(&local_430);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6b0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_430);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    local_488 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_480,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,2);
    local_520[3] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_510,&B,local_520 + 3);
    local_520[2] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_500,&C,local_520 + 2);
    local_520[1] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_4f0,&D,local_520 + 1);
    local_520[0] = 2;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_4e0,(HeapType *)&builder,local_520);
    local_4d0 = &local_510;
    local_4c8 = 4;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_523);
    __l_03._M_len = local_4c8;
    __l_03._M_array = local_4d0;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_4c0,__l_03,0,&local_521,&local_522,&local_523);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_448,"getSubTypes(A, 2)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",&local_480,&local_4c0);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_4c0);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_523);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_480);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar1) {
      testing::Message::Message(&local_530);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6b1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_530);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_530);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    local_588 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_580,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,3);
    local_620[3] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_610,&B,local_620 + 3);
    local_620[2] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_600,&C,local_620 + 2);
    local_620[1] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_5f0,&D,local_620 + 1);
    local_620[0] = 2;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_5e0,(HeapType *)&builder,local_620);
    local_5d0 = &local_610;
    local_5c8 = 4;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_623);
    __l_02._M_len = local_5c8;
    __l_02._M_array = local_5d0;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_5c0,__l_02,0,&local_621,&local_622,&local_623);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_548,"getSubTypes(A, 3)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",&local_580,&local_5c0);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_5c0);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_623);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
    if (!bVar1) {
      testing::Message::Message(&local_630);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6b2,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_630);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_630);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
    local_688 = D.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_680,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,D,0);
    local_6e4 = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_6e0,&D,&local_6e4);
    local_6d0 = &local_6e0;
    local_6c8 = 1;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_6e7);
    __l_01._M_len = local_6c8;
    __l_01._M_array = local_6d0;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_6c0,__l_01,0,&local_6e5,&local_6e6,&local_6e7);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_648,"getSubTypes(C, 0)","TypeDepths({{C, 0}})",&local_680,
               &local_6c0);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_6c0);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_6e7);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_680);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar1) {
      testing::Message::Message(&local_6f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6b4,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_6f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_6f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    local_748 = D.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_740,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,D,1);
    local_7b8[1] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_7b0,&D,local_7b8 + 1);
    local_7b8[0] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_7a0,(HeapType *)&builder,local_7b8);
    local_790 = &local_7b0;
    local_788 = 2;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_7bb);
    __l_00._M_len = local_788;
    __l_00._M_array = local_790;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_780,__l_00,0,&local_7b9,&local_7ba,&local_7bb);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_708,"getSubTypes(C, 1)","TypeDepths({{C, 0}, {D, 1}})",&local_740,
               &local_780);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_780);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_7bb);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_740);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
    if (!bVar1) {
      testing::Message::Message(&local_7c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6b5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_7c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_7c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
    local_820 = D.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_818,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,D,2);
    local_890[1] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_888,&D,local_890 + 1);
    local_890[0] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_878,(HeapType *)&builder,local_890);
    local_868 = &local_888;
    local_860 = 2;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_893);
    __l._M_len = local_860;
    __l._M_array = local_868;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_858,__l,0,&local_891,&local_892,&local_893);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_7e0,"getSubTypes(C, 2)","TypeDepths({{C, 0}, {D, 1}})",&local_818,
               &local_858);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_858);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_893);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_818);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
    if (!bVar1) {
      testing::Message::Message(&local_8a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_8a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x6b6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
      testing::internal::AssertHelper::~AssertHelper(&local_8a8);
      testing::Message::~Message(&local_8a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
    ::wasm::SubTypes::~SubTypes((SubTypes *)local_238);
  }
  return;
}

Assistant:

TEST_F(TypeTest, TestIterSubTypes) {
  /*
        A
       / \
      B   C
           \
            D
  */
  HeapType A, B, C, D;
  {
    TypeBuilder builder(4);
    builder[0].setOpen() = Struct();
    builder[1].setOpen().subTypeOf(builder[0]) = Struct();
    builder[2].setOpen().subTypeOf(builder[0]) = Struct();
    builder[3].setOpen().subTypeOf(builder[2]) = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
    C = built[2];
    D = built[3];
  }

  SubTypes subTypes({A, B, C, D});

  // Helper for comparing sets of types + their corresponding depth.
  using TypeDepths = std::unordered_set<std::pair<HeapType, Index>>;

  auto getSubTypes = [&](HeapType type, Index depth) {
    TypeDepths ret;
    subTypes.iterSubTypes(type, depth, [&](HeapType subType, Index depth) {
      ret.insert({subType, depth});
    });
    return ret;
  };

  EXPECT_EQ(getSubTypes(A, 0), TypeDepths({{A, 0}}));
  EXPECT_EQ(getSubTypes(A, 1), TypeDepths({{A, 0}, {B, 1}, {C, 1}}));
  EXPECT_EQ(getSubTypes(A, 2), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));
  EXPECT_EQ(getSubTypes(A, 3), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));

  EXPECT_EQ(getSubTypes(C, 0), TypeDepths({{C, 0}}));
  EXPECT_EQ(getSubTypes(C, 1), TypeDepths({{C, 0}, {D, 1}}));
  EXPECT_EQ(getSubTypes(C, 2), TypeDepths({{C, 0}, {D, 1}}));
}